

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_replaceRange_success_indexInBoundsRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"01234x",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_replaceRange(&string,5,0x29a,'y',2);
  if (bVar1 == false) {
    pcVar6 = "Assertion \'AString_replaceRange(&string, 5, 666, \'y\', 2)\' failed";
    iVar2 = 0x570;
LAB_001348fc:
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar6,0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x570);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x571);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x571);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar2 = strcmp("01234yy",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x571);
          if (string.size != 7) {
            pcVar6 = "strlen(\"01234yy\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).size == strlen(\"01234yy\")";
            pcVar5 = "(string).size";
            goto LAB_001348a1;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x571);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            pcVar6 = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x572;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_00134a3e;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x572);
          bVar1 = AString_replaceRange(&string,6,0x2a,'z',2);
          if (bVar1 == false) {
            pcVar6 = "Assertion \'AString_replaceRange(&string, 6, 42, \'z\', 2)\' failed";
            iVar2 = 0x573;
            goto LAB_001348fc;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x573);
          if (string.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x574);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x574);
              pcVar6 = string.buffer;
              if (string.buffer == (char *)0x0) {
                pcVar6 = "(null)";
                string.size = 0x16819b;
              }
              else {
                iVar2 = strcmp("01234yzz",string.buffer);
                if (iVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x574);
                  if (string.size == 8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x574);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x575);
                      (*string.deallocator)(string.buffer);
                      return;
                    }
                    pcVar6 = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x575;
                    string.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_00134a3e;
                  }
                  pcVar6 = "strlen(\"01234yzz\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar4 = "(string).size == strlen(\"01234yzz\")";
                  pcVar5 = "(string).size";
                  goto LAB_00134a39;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(string).buffer == (\"01234yzz\")";
              pcVar5 = "(string).buffer";
            }
          }
          else {
            pcVar6 = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).capacity == (8)";
            pcVar5 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_00134a39:
          iVar2 = 0x574;
          goto LAB_00134a3e;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"01234yy\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (8)";
    pcVar5 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_001348a1:
  iVar2 = 0x571;
LAB_00134a3e:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,string.size,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRange_success_indexInBoundsRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234x", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRange(&string, 5, 666, 'y', 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234yy", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRange(&string, 6, 42, 'z', 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234yzz", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}